

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O3

GLuint __thiscall
QOpenGL2PaintEngineExPrivate::bindTexture<QPixmap>
          (QOpenGL2PaintEngineExPrivate *this,QPixmap *pixmap,bool *newTextureCreated)

{
  Data *pDVar1;
  QOpenGLTextureCache *this_00;
  BindResult BVar2;
  QOpenGLContext *context;
  QObject *context_00;
  
  pDVar1 = (this->ctx).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    context_00 = (QObject *)0x0;
  }
  else {
    context_00 = (this->ctx).wp.value;
  }
  this_00 = QOpenGLTextureCache::cacheForContext((QOpenGLContext *)context_00);
  pDVar1 = (this->ctx).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    context = (QOpenGLContext *)0x0;
  }
  else {
    context = (QOpenGLContext *)(this->ctx).wp.value;
  }
  BVar2 = QOpenGLTextureCache::bindTexture(this_00,context,pixmap,(BindOptions)0x1);
  if (newTextureCreated != (bool *)0x0) {
    *newTextureCreated =
         (bool)((byte)BVar2.flags.super_QFlagsStorageHelper<QOpenGLTextureCache::BindResultFlag,_4>.
                      super_QFlagsStorage<QOpenGLTextureCache::BindResultFlag>.i & 1);
  }
  return BVar2.id;
}

Assistant:

GLuint QOpenGL2PaintEngineExPrivate::bindTexture(const QPixmap &pixmap, bool *newTextureCreated)
{
    QOpenGLTextureCache::BindResult result = QOpenGLTextureCache::cacheForContext(ctx)->bindTexture(ctx, pixmap);
    if (newTextureCreated)
        *newTextureCreated = result.flags.testFlag(QOpenGLTextureCache::BindResultFlag::NewTexture);
    return result.id;
}